

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
ot::commissioner::Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator
          (NetworkSelectionComparator *this)

{
  Status SVar1;
  char *pcVar2;
  allocator local_89;
  string local_88;
  Network nwk;
  
  if (this->mSuccess == true) {
    persistent_storage::Network::Network(&nwk);
    SVar1 = persistent_storage::Registry::GetCurrentNetwork
                      ((this->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&nwk);
    if ((SVar1 == kSuccess) && (this->mStartWith != nwk.mXpan)) {
      pcVar2 = "Network selection was changed by the command";
      if (nwk.mXpan == 0) {
        pcVar2 = "Network selection was dropped by the command";
      }
      std::__cxx11::string::string((string *)&local_88,pcVar2,&local_89);
      Console::Write(&local_88,kYellow);
      std::__cxx11::string::~string((string *)&local_88);
    }
    persistent_storage::Network::~Network(&nwk);
  }
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator()
{
    if (mSuccess)
    {
        Network        nwk;
        RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

        if (status == RegistryStatus::kSuccess && mStartWith != nwk.mXpan)
        {
            Console::Write(nwk.mXpan == 0 ? WARN_NETWORK_SELECTION_DROPPED : WARN_NETWORK_SELECTION_CHANGED,
                           Console::Color::kYellow);
        }
    }
}